

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::NegativeCompileErrors::Run(NegativeCompileErrors *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "\nlayout(rgba32f) writeonly readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
             ,"");
  bVar2 = Compile(this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  lVar3 = -1;
  if (bVar2) {
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "\nlayout(rgba32f) writeonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
               ,"");
    bVar2 = Compile(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_40._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "\nuniform vec4 i_color;\nlayout(rgba32f) readonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec2(0), i_color);\n  o_color = i_color;\n}"
                 ,"");
      bVar2 = Compile(this,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if (bVar2) {
        local_40._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,
                   "\nuniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                   ,"");
        bVar2 = Compile(this,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_40._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_40,
                     "\nreadonly uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = imageLoad(g_image, ivec2(0));\n}"
                     ,"");
          bVar2 = Compile(this,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != paVar1) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            local_40._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,
                       "\nlayout(r32i) uniform image1D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                       ,"");
            bVar2 = Compile(this,&local_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != paVar1) {
              operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              local_40._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_40,
                         "\nlayout(rgba16) writeonly uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  o_color = vec4(1.0);\n}"
                         ,"");
              bVar2 = Compile(this,&local_40);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_40._M_dataplus._M_p != paVar1) {
                operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar2) {
                local_40._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_40,
                           "\n#extension GL_OES_shader_image_atomic : require\nlayout(r32f) coherent uniform image2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 10);\n  o_color = vec4(1.0);\n}"
                           ,"");
                bVar2 = Compile(this,&local_40);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_40._M_dataplus._M_p != paVar1) {
                  operator_delete(local_40._M_dataplus._M_p,
                                  local_40.field_2._M_allocated_capacity + 1);
                }
                if (bVar2) {
                  local_40._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_40,
                             "\n#extension GL_OES_shader_image_atomic : require\nlayout(rgba8i) coherent uniform iimage2D g_image;\nvoid main() {\n  vec4 o_color;\n  imageAtomicAdd(g_image, ivec2(1), 1);\n  o_color = vec4(1.0);\n}"
                             ,"");
                  bVar2 = Compile(this,&local_40);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_40._M_dataplus._M_p != paVar1) {
                    operator_delete(local_40._M_dataplus._M_p,
                                    local_40.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar2) {
                    local_40._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_40,
                               "\nlayout(r32ui) uniform iimage3D g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(1), ivec4(1));\n  o_color = vec4(1.0);\n}"
                               ,"");
                    bVar2 = Compile(this,&local_40);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_40._M_dataplus._M_p != paVar1) {
                      operator_delete(local_40._M_dataplus._M_p,
                                      local_40.field_2._M_allocated_capacity + 1);
                    }
                    if (bVar2) {
                      local_40._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_40,
                                 "\nlayout(r32f) uniform uimage2DArray g_image;\nvoid main() {\n  vec4 o_color;\n  imageStore(g_image, ivec3(0), uvec4(1));\n  o_color = vec4(1.0);\n}"
                                 ,"");
                      bVar2 = Compile(this,&local_40);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_40._M_dataplus._M_p != paVar1) {
                        operator_delete(local_40._M_dataplus._M_p,
                                        local_40.field_2._M_allocated_capacity + 1);
                      }
                      if (bVar2) {
                        local_40._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_40,
                                   "\nlayout(r32f) coherent uniform image2D g_image;\nvec4 Load(iimage2D image) {\n  return imageLoad(image, vec2(0));\n}\nvoid main() {\n  vec4 o_color;\n  o_color = Load(g_image);\n}"
                                   ,"");
                        bVar2 = Compile(this,&local_40);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_40._M_dataplus._M_p != paVar1) {
                          operator_delete(local_40._M_dataplus._M_p,
                                          local_40.field_2._M_allocated_capacity + 1);
                        }
                        lVar3 = (ulong)bVar2 - 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		if (!Compile( // writeonly & readonly qualifiers
				NL "layout(rgba32f) writeonly readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // writeonly && reading
				NL "layout(rgba32f) writeonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( //readonly && writing
				NL "uniform vec4 i_color;" NL "layout(rgba32f) readonly uniform image2D g_image;" NL "void main() {" NL
				   "  vec4 o_color;" NL "  imageStore(g_image, ivec2(0), i_color);" NL "  o_color = i_color;" NL "}"))
			return ERROR;

		if (!Compile( // no format layout && load
				NL "uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // no fromat layout && readonly && load
				NL "readonly uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = imageLoad(g_image, ivec2(0));" NL "}"))
			return ERROR;

		if (!Compile( // target type image1D not supported
				NL "layout(r32i) uniform image1D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(rgba16) writeonly uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support r32f
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(r32f) coherent uniform image2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 10);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // imageAtomicAdd doesn't support rgba8i
				NL "#extension GL_OES_shader_image_atomic : require" NL
				   "layout(rgba8i) coherent uniform iimage2D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageAtomicAdd(g_image, ivec2(1), 1);" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32ui) uniform iimage3D g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(1), ivec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // format layout not compatible with type
				NL "layout(r32f) uniform uimage2DArray g_image;" NL "void main() {" NL "  vec4 o_color;" NL
				   "  imageStore(g_image, ivec3(0), uvec4(1));" NL "  o_color = vec4(1.0);" NL "}"))
			return ERROR;

		if (!Compile( // wrong function argument type
				NL "layout(r32f) coherent uniform image2D g_image;" NL "vec4 Load(iimage2D image) {" NL
				   "  return imageLoad(image, vec2(0));" NL "}" NL "void main() {" NL "  vec4 o_color;" NL
				   "  o_color = Load(g_image);" NL "}"))
			return ERROR;

		return NO_ERROR;
	}